

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeSIMDShuffle<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  optional<unsigned_char> oVar1;
  long lVar2;
  string local_90;
  _Storage<unsigned_char,_true> local_70 [8];
  array<unsigned_char,_16UL> lanes;
  allocator<char> local_31;
  
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x10) {
      ParseDefsCtx::makeSIMDShuffle
                (__return_storage_ptr__,ctx,pos,annotations,(array<unsigned_char,_16UL> *)local_70);
      return __return_storage_ptr__;
    }
    oVar1 = Lexer::takeU<unsigned_char>(&ctx->in);
    if (((ushort)oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_char> >> 8 & 1) == 0) break;
    local_70[lVar2]._M_value =
         oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_char>._M_payload;
    lVar2 = lVar2 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"expected lane index",&local_31);
  Lexer::err((Err *)(lanes._M_elems + 8),&ctx->in,&local_90);
  std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
  _Variant_storage<1ul,wasm::Err>
            ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,lanes._M_elems + 8
            );
  std::__cxx11::string::~string((string *)(lanes._M_elems + 8));
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDShuffle(Ctx& ctx,
                         Index pos,
                         const std::vector<Annotation>& annotations) {
  std::array<uint8_t, 16> lanes;
  for (int i = 0; i < 16; ++i) {
    auto lane = ctx.in.takeU8();
    if (!lane) {
      return ctx.in.err("expected lane index");
    }
    lanes[i] = *lane;
  }
  return ctx.makeSIMDShuffle(pos, annotations, lanes);
}